

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

Expression *
slang::ast::ReplicationExpression::fromSyntax
          (Compilation *compilation,MultipleConcatenationExpressionSyntax *syntax,
          ASTContext *context)

{
  ASTContext *this;
  bool bVar1;
  bitwidth_t value;
  ExpressionSyntax *syntax_00;
  Expression *pEVar2;
  ConcatenationExpressionSyntax *pCVar3;
  Expression *args_2;
  ReplicationExpression *expr;
  Type *pTVar4;
  SourceLocation location;
  Diagnostic *diag;
  Diagnostic *diag_00;
  optional<int> value_00;
  optional<unsigned_int> oVar5;
  ReplicationExpression *this_00;
  _Storage<int,_true> _Var6;
  SourceRange SVar7;
  Token TVar8;
  Expression *right;
  ASTContext *local_2a0;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_298 [2];
  ConstantValue leftVal;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_260 [2];
  EvalContext evalCtx;
  
  syntax_00 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->expression);
  pEVar2 = Expression::selfDetermined
                     (compilation,syntax_00,context,(bitmask<slang::ast::ASTFlags>)0x0);
  pCVar3 = not_null<slang::syntax::ConcatenationExpressionSyntax_*>::get(&syntax->concatenation);
  local_2a0 = context;
  args_2 = Expression::create(compilation,(ExpressionSyntax *)pCVar3,context,
                              (bitmask<slang::ast::ASTFlags>)0x0,(Type *)0x0);
  pTVar4 = compilation->errorType;
  right = args_2;
  SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  evalCtx.compilation = (Compilation *)SVar7.startLoc;
  evalCtx._8_4_ = SVar7.endLoc._0_4_;
  evalCtx.steps = SVar7.endLoc._4_4_;
  expr = BumpAllocator::
         emplace<slang::ast::ReplicationExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,pTVar4,pEVar2,args_2,(SourceRange *)&evalCtx);
  bVar1 = Expression::bad(pEVar2);
  if ((bVar1) || (bVar1 = Expression::bad(args_2), bVar1)) goto LAB_00321e7d;
  this_00 = (ReplicationExpression *)&pEVar2->type;
  pTVar4 = not_null<const_slang::ast::Type_*>::get((not_null<const_slang::ast::Type_*> *)this_00);
  bVar1 = Type::isIntegral(pTVar4);
  if (!bVar1) {
LAB_00321fc8:
    pCVar3 = not_null<slang::syntax::ConcatenationExpressionSyntax_*>::get(&syntax->concatenation);
    TVar8 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)pCVar3);
    evalCtx.compilation = TVar8._0_8_;
    evalCtx._8_4_ = TVar8.info._0_4_;
    evalCtx.steps = TVar8.info._4_4_;
    location = parsing::Token::location((Token *)&evalCtx);
    diag = ASTContext::addDiag(local_2a0,(DiagCode)0x250007,location);
    pTVar4 = not_null<const_slang::ast::Type_*>::get((not_null<const_slang::ast::Type_*> *)this_00);
    diag_00 = ast::operator<<(diag,pTVar4);
    pTVar4 = not_null<const_slang::ast::Type_*>::get(&right->type);
    ast::operator<<(diag_00,pTVar4);
    Diagnostic::operator<<(diag,pEVar2->sourceRange);
    Diagnostic::operator<<(diag,right->sourceRange);
LAB_00321e7d:
    pEVar2 = Expression::badExpr(compilation,&expr->super_Expression);
    return pEVar2;
  }
  pTVar4 = not_null<const_slang::ast::Type_*>::get(&right->type);
  bVar1 = Type::isIntegral(pTVar4);
  if (!bVar1) {
    pTVar4 = not_null<const_slang::ast::Type_*>::get(&right->type);
    bVar1 = Type::isString(pTVar4);
    if (!bVar1) goto LAB_00321fc8;
  }
  evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
       (pointer)evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement;
  evalCtx.flags.m_bits = '\x02';
  evalCtx.steps = 0;
  evalCtx.disableTarget._0_4_ = 0;
  evalCtx._20_8_ = 0;
  evalCtx.queueTarget._4_4_ = 0;
  evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
  evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
  evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
       (pointer)evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
  evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
  evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
  evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
  data_ = (pointer)evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                   super_SmallVectorBase<slang::Diagnostic>.firstElement;
  evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
  len = 0;
  evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
  cap = 2;
  evalCtx.disableRange.startLoc = (SourceLocation)0x0;
  evalCtx.disableRange.endLoc = (SourceLocation)0x0;
  evalCtx.compilation = compilation;
  Expression::eval(&leftVal,pEVar2,&evalCtx);
  if (leftVal.value.
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ._M_index == '\0') {
    bVar1 = Expression::isImplicitString(right);
    if (bVar1) {
      Expression::contextDetermined(local_2a0,&right,compilation->stringType,(SourceLocation)0x0);
      expr->concat_ = right;
      local_260[0] = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)compilation->stringType;
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)local_298,(Type **)&local_260[0].pVal);
      (expr->super_Expression).type.ptr = (Type *)local_298[0];
      this_00 = expr;
    }
    else {
      EvalContext::reportDiags(&evalCtx,local_2a0);
      this_00 = (ReplicationExpression *)Expression::badExpr(compilation,&expr->super_Expression);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&leftVal);
  this = local_2a0;
  if (leftVal.value.
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ._M_index == '\0') goto LAB_0032213b;
  value_00 = ASTContext::evalInteger(local_2a0,pEVar2);
  if (((ulong)value_00.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
    _Var6._M_value =
         value_00.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
         ._M_payload;
    if (-1 < _Var6._M_value) {
      if (_Var6._M_value == 0) {
        if (((this->flags).m_bits & 1) == 0) {
          ASTContext::addDiag(this,(DiagCode)0x820007,pEVar2->sourceRange);
          goto LAB_0032212d;
        }
        local_298[0] = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)compilation->voidType;
        not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                  ((not_null<slang::ast::Type_const*> *)&leftVal,(Type **)&local_298[0].pVal);
      }
      else {
        Expression::selfDetermined(this,&right);
        expr->concat_ = right;
        pTVar4 = not_null<const_slang::ast::Type_*>::get(&right->type);
        bVar1 = Type::isString(pTVar4);
        if (!bVar1) {
          SVInt::SVInt((SVInt *)local_298,0x20,(ulong)(_Var6._M_value & 0x7fffffff),true);
          pTVar4 = not_null<const_slang::ast::Type_*>::get(&right->type);
          value = Type::getBitWidth(pTVar4);
          SVInt::SVInt<unsigned_int,void>((SVInt *)local_260,value);
          SVInt::operator*((SVInt *)&leftVal,(SVInt *)local_298);
          SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          oVar5 = ASTContext::requireValidBitWidth(this,(SVInt *)&leftVal,SVar7);
          SVInt::~SVInt((SVInt *)&leftVal);
          SVInt::~SVInt((SVInt *)local_260);
          SVInt::~SVInt((SVInt *)local_298);
          if (((ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
            this_00 = (ReplicationExpression *)
                      Expression::badExpr(compilation,&expr->super_Expression);
          }
          else {
            pTVar4 = not_null<const_slang::ast::Type_*>::get(&right->type);
            bVar1 = Type::isFourState(pTVar4);
            local_298[0].pVal =
                 (uint64_t *)
                 Compilation::getType
                           (compilation,
                            oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_int>._M_payload,
                            (bitmask<slang::ast::IntegralFlags>)(bVar1 * '\x02'));
            not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                      ((not_null<slang::ast::Type_const*> *)&leftVal,(Type **)&local_298[0].pVal);
            (expr->super_Expression).type.ptr =
                 (Type *)leftVal.value.
                         super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         .
                         super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         .
                         super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         .
                         super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         .
                         super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         .
                         super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         ._M_u._0_8_;
            this_00 = expr;
          }
          goto LAB_0032213b;
        }
        local_298[0] = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)compilation->stringType;
        not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                  ((not_null<slang::ast::Type_const*> *)&leftVal,(Type **)&local_298[0].pVal);
      }
      (expr->super_Expression).type.ptr =
           (Type *)leftVal.value.
                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   ._M_u._0_8_;
      this_00 = expr;
      goto LAB_0032213b;
    }
    ASTContext::requireGtZero(this,value_00,pEVar2->sourceRange);
  }
LAB_0032212d:
  this_00 = (ReplicationExpression *)Expression::badExpr(compilation,&expr->super_Expression);
LAB_0032213b:
  EvalContext::~EvalContext(&evalCtx);
  return &this_00->super_Expression;
}

Assistant:

Expression& ReplicationExpression::fromSyntax(Compilation& compilation,
                                              const MultipleConcatenationExpressionSyntax& syntax,
                                              const ASTContext& context) {
    Expression& left = selfDetermined(compilation, *syntax.expression, context);
    Expression* right = &create(compilation, *syntax.concatenation, context);

    auto result = compilation.emplace<ReplicationExpression>(compilation.getErrorType(), left,
                                                             *right, syntax.sourceRange());
    if (left.bad() || right->bad())
        return badExpr(compilation, result);

    if (!left.type->isIntegral() || (!right->type->isIntegral() && !right->type->isString())) {
        auto& diag = context.addDiag(diag::BadReplicationExpression,
                                     syntax.concatenation->getFirstToken().location());
        diag << *left.type << *right->type;
        diag << left.sourceRange;
        diag << right->sourceRange;
        return badExpr(compilation, result);
    }

    // If the multiplier isn't constant this must be a string replication.
    EvalContext evalCtx(compilation, EvalFlags::CacheResults);
    if (ConstantValue leftVal = left.eval(evalCtx); !leftVal) {
        if (!right->isImplicitString()) {
            // They probably meant for this to be a constant (non-string) replication,
            // so do the normal error reporting for that case.
            evalCtx.reportDiags(context);
            return badExpr(compilation, result);
        }

        contextDetermined(context, right, compilation.getStringType());

        result->concat_ = right;
        result->type = &compilation.getStringType();
        return *result;
    }

    std::optional<int32_t> count = context.evalInteger(left);
    if (!count)
        return badExpr(compilation, result);

    if (*count < 0) {
        context.requireGtZero(count, left.sourceRange);
        return badExpr(compilation, result);
    }

    if (*count == 0) {
        if ((context.flags & ASTFlags::InsideConcatenation) == 0) {
            context.addDiag(diag::ReplicationZeroOutsideConcat, left.sourceRange);
            return badExpr(compilation, result);
        }

        // Use a placeholder type here to indicate to the parent concatenation that this had a
        // zero width.
        result->type = &compilation.getVoidType();
        return *result;
    }

    selfDetermined(context, right);
    result->concat_ = right;

    if (right->type->isString()) {
        result->type = &compilation.getStringType();
        return *result;
    }

    auto width = context.requireValidBitWidth(
        SVInt(32, uint64_t(*count), true) * right->type->getBitWidth(), syntax.sourceRange());
    if (!width)
        return badExpr(compilation, result);

    result->type = &compilation.getType(*width, right->type->isFourState()
                                                    ? IntegralFlags::FourState
                                                    : IntegralFlags::TwoState);
    return *result;
}